

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opj_decompress.c
# Opt level: O2

int get_file_format(char *filename)

{
  long lVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  
  pcVar3 = strrchr(filename,0x2e);
  iVar2 = -1;
  if ((pcVar3 != (char *)0x0) && (pcVar3[1] != '\0')) {
    lVar1 = 0;
    do {
      lVar4 = lVar1;
      if (lVar4 == 0x3c) {
        return -1;
      }
      iVar2 = strcasecmp(pcVar3 + 1,
                         (char *)((long)&get_file_format_extension_rel +
                                 (long)*(int *)((long)&get_file_format_extension_rel + lVar4)));
      lVar1 = lVar4 + 4;
    } while (iVar2 != 0);
    iVar2 = *(int *)((long)get_file_format::format + lVar4);
  }
  return iVar2;
}

Assistant:

int get_file_format(const char *filename)
{
    unsigned int i;
    static const char *extension[] = {"pgx", "pnm", "pgm", "ppm", "bmp", "tif", "raw", "rawl", "tga", "png", "j2k", "jp2", "jpt", "j2c", "jpc" };
    static const int format[] = { PGX_DFMT, PXM_DFMT, PXM_DFMT, PXM_DFMT, BMP_DFMT, TIF_DFMT, RAW_DFMT, RAWL_DFMT, TGA_DFMT, PNG_DFMT, J2K_CFMT, JP2_CFMT, JPT_CFMT, J2K_CFMT, J2K_CFMT };
    const char * ext = strrchr(filename, '.');
    if (ext == NULL) {
        return -1;
    }
    ext++;
    if (*ext) {
        for (i = 0; i < sizeof(format) / sizeof(*format); i++) {
            if (strcasecmp(ext, extension[i]) == 0) {
                return format[i];
            }
        }
    }

    return -1;
}